

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O2

UINT8 DecompressDataBlk_VGM
                (UINT32 *outLen,UINT8 **retOutData,UINT32 inLen,UINT8 *inData,
                PCM_COMPR_TBL *comprTbl)

{
  UINT8 UVar1;
  UINT8 *outData;
  PCM_CDB_INF comprInf;
  PCM_CDB_INF local_48;
  
  UVar1 = ReadComprDataBlkHdr(inLen,inData,&local_48);
  if (UVar1 == '\0') {
    *outLen = local_48.decmpLen;
    outData = (UINT8 *)realloc(*retOutData,(ulong)local_48.decmpLen);
    *retOutData = outData;
    local_48.cmprInfo.comprTbl = comprTbl;
    UVar1 = DecompressDataBlk(*outLen,outData,inLen - local_48.hdrSize,inData + local_48.hdrSize,
                              &local_48.cmprInfo);
  }
  return UVar1;
}

Assistant:

UINT8 DecompressDataBlk_VGM(UINT32* outLen, UINT8** retOutData, UINT32 inLen, const UINT8* inData, const PCM_COMPR_TBL* comprTbl)
{
	UINT8 retVal;
	PCM_CDB_INF comprInf;
	
	retVal = ReadComprDataBlkHdr(inLen, inData, &comprInf);
	if (retVal)
		return retVal;
	
	*outLen = comprInf.decmpLen;
	*retOutData = (UINT8*)realloc(*retOutData, *outLen);
	comprInf.cmprInfo.comprTbl = comprTbl;
	
	return DecompressDataBlk(*outLen, *retOutData, inLen - comprInf.hdrSize, &inData[comprInf.hdrSize], &comprInf.cmprInfo);
}